

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O3

Any __thiscall amrex::MLLinOp::AnyMake(MLLinOp *this,int amrlev,int mglev,IntVect *ng)

{
  long lVar1;
  int ncomp;
  _func_int **pp_Var2;
  long lVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  IntVect *in_R8;
  MFInfo local_240;
  BoxArray local_218;
  MultiFab local_1b0;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,amrlev);
  lVar1 = (long)mglev * 0x18;
  lVar3 = (long)(int)ng;
  convert(&local_218,(BoxArray *)(lVar3 * 0x68 + *(long *)(plVar4[0x16] + lVar1)),
          (IntVect *)(plVar4 + 0xe));
  lVar1 = *(long *)(plVar4[0x19] + lVar1);
  ncomp = (**(code **)(*plVar4 + 0x28))(plVar4);
  local_240.alloc = true;
  local_240._1_7_ = 0;
  local_240.arena = (Arena *)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&local_1b0,&local_218,(DistributionMapping *)(lVar1 + lVar3 * 0x10),ncomp,in_R8
                     ,&local_240,
                     *(FabFactory<amrex::FArrayBox> **)
                      (*(long *)(plVar4[0x1c] + (long)mglev * 0x18) + lVar3 * 8));
  pp_Var2 = (_func_int **)operator_new(0x188);
  *pp_Var2 = (_func_int *)&PTR_Type_0080e380;
  MultiFab::MultiFab((MultiFab *)(pp_Var2 + 1),&local_1b0);
  this->_vptr_MLLinOp = pp_Var2;
  MultiFab::~MultiFab(&local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  BoxArray::~BoxArray(&local_218);
  return (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
         (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)this;
}

Assistant:

Any
MLLinOp::AnyMake (int amrlev, int mglev, IntVect const& ng) const
{
    return Any(MultiFab(amrex::convert(m_grids[amrlev][mglev], m_ixtype),
                        m_dmap[amrlev][mglev], getNComp(), ng, MFInfo(),
                        *m_factory[amrlev][mglev]));
}